

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

void __thiscall
HttpReqThread::post_result(HttpReqThread *this,int status,CVmDataSource *reply,char *hdrs,char *loc)

{
  TadsHttpReqResult *this_00;
  
  this_00 = (TadsHttpReqResult *)operator_new(0x68);
  TadsHttpReqResult::TadsHttpReqResult(this_00,this->idg,status,reply,hdrs,loc);
  TadsMessageQueue::post(this->queue,(TadsMessage *)this_00);
  this->idg = (vm_globalvar_t *)0x0;
  return;
}

Assistant:

void post_result(int status, CVmDataSource *reply, char *hdrs, char *loc)
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* create the result event */
        TadsHttpReqResult *evt = new TadsHttpReqResult(
            vmg_ idg, status, reply, hdrs, loc);

        /* post the event (this transfers ownership to the queue) */
        queue->post(evt);

        /* the result event now owns our ID global 'idg', so forget it */
        idg = 0;
    }